

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_sid.cpp
# Opt level: O0

bool __thiscall
cppcms::sessions::session_sid::load
          (session_sid *this,session_interface *session,string *data,time_t *timeout)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  time_t tVar4;
  long *in_RCX;
  undefined8 in_RDX;
  string tmp_data;
  string id;
  string local_98 [32];
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  string *in_stack_ffffffffffffff90;
  session_sid *in_stack_ffffffffffffff98;
  string local_48 [32];
  long *local_28;
  undefined8 local_20;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::__cxx11::string::string(local_48);
  session_interface::get_session_cookie_abi_cxx11_
            ((session_interface *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = valid_sid(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                    (string *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_98);
    peVar3 = std::
             __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x43e497);
    uVar2 = (*peVar3->_vptr_session_storage[1])(peVar3,local_48,local_28,local_20);
    if ((uVar2 & 1) == 0) {
      local_1 = 0;
    }
    else {
      tVar4 = time((time_t *)0x0);
      if (*local_28 < tVar4) {
        peVar3 = std::
                 __shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x43e518);
        (*peVar3->_vptr_session_storage[2])(peVar3,local_48);
        local_1 = 0;
      }
      else {
        local_1 = 1;
      }
    }
    std::__cxx11::string::~string(local_98);
  }
  else {
    local_1 = 0;
  }
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool session_sid::load(session_interface &session,std::string &data,time_t &timeout)
{
	std::string id;
	if(!valid_sid(session.get_session_cookie(),id))
		return false;
	std::string tmp_data;
	if(!storage_->load(id,timeout,data))
		return false;
	if(time(0) > timeout) {
		storage_->remove(id);
		return false;
	}
	return true;
}